

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O1

char * __thiscall
Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
          (Recycler *this,size_t size)

{
  char *memBlock;
  HeapBlock *pHVar1;
  size_t __n;
  
  memBlock = AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>(this,size);
  if ((this->verifyEnabled == false) && (this->isPageHeapEnabled != true)) {
    memBlock[0] = '\0';
    memBlock[1] = '\0';
    memBlock[2] = '\0';
    memBlock[3] = '\0';
    memBlock[4] = '\0';
    memBlock[5] = '\0';
    memBlock[6] = '\0';
    memBlock[7] = '\0';
  }
  else {
    __n = 8;
    if (size < 8) {
      __n = size;
    }
    memset(memBlock,0,__n);
  }
  VerifyPageHeapFillAfterAlloc(this,memBlock,size,WithBarrierBit);
  if ((DAT_015d641e == '\x01') && (DAT_015ca846 == '\x01')) {
    pHVar1 = HeapBlockMap64::GetHeapBlock(&this->heapBlockMap,memBlock);
    (*pHVar1->_vptr_HeapBlock[4])(pHVar1,memBlock);
  }
  return memBlock;
}

Assistant:

char* AllocZeroWithAttributes(DECLSPEC_GUARD_OVERFLOW size_t size)
    {
        return AllocZeroWithAttributesInlined<attributes, nothrow>(size);
    }